

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameCataloger.h
# Opt level: O0

void __thiscall psy::C::NameCataloger::~NameCataloger(NameCataloger *this)

{
  NameCataloger *this_local;
  
  (this->super_SyntaxVisitor)._vptr_SyntaxVisitor = (_func_int **)&PTR__NameCataloger_00732a38;
  std::unique_ptr<psy::C::NameCatalog,_std::default_delete<psy::C::NameCatalog>_>::~unique_ptr
            (&this->catalog_);
  SyntaxVisitor::~SyntaxVisitor(&this->super_SyntaxVisitor);
  return;
}

Assistant:

class PSY_C_INTERNAL_API NameCataloger : public SyntaxVisitor
{
public:
    NameCataloger(SyntaxTree* tree);

    std::unique_ptr<NameCatalog> catalogNamesWithinNode(const SyntaxNode*);

private:
    std::unique_ptr<NameCatalog> catalog_;
    bool withinTypedef_;

    using SyntaxVisitor::visit;
    using Base = SyntaxVisitor;

    //--------------//
    // Declarations //
    //--------------//
    Action visitTranslationUnit(const TranslationUnitSyntax*) override;
    Action visitTypedefDeclaration(const TypedefDeclarationSyntax*) override;

    /* Specifiers */
    Action visitTypedefName(const TypedefNameSyntax*) override;

    /* Declarators */
    Action visitIdentifierDeclarator(const IdentifierDeclaratorSyntax*) override;

    //-------------//
    // Expressions //
    //-------------//
    Action visitIdentifierName(const IdentifierNameSyntax*) override;

    //------------//
    // Statements //
    //------------//
    Action visitCompoundStatement(const CompoundStatementSyntax*) override;

    //-------------//
    // Ambiguities //
    //-------------//
    Action visitAmbiguousTypeNameOrExpressionAsTypeReference(const AmbiguousTypeNameOrExpressionAsTypeReferenceSyntax*) override;
    Action visitAmbiguousCastOrBinaryExpression(const AmbiguousCastOrBinaryExpressionSyntax*) override;
    Action visitAmbiguousExpressionOrDeclarationStatement(const AmbiguousExpressionOrDeclarationStatementSyntax*) override;
}